

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O1

_Bool render_tour_image(char *filepath,Instance *instance,Tour *tour,char *filext)

{
  uint uVar1;
  Vec2d *pVVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  FILE *__s;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  _Bool _Var11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  char command [8192];
  char local_2038 [8191];
  undefined1 local_39;
  
  pcVar5 = guess_plot_filext(filepath,filext);
  uVar4 = instance->num_customers;
  if ((int)uVar4 < 0) {
    dVar14 = 9999999.0;
    dVar12 = 99999999.0;
    dVar18 = -9999999.0;
    dVar16 = -9999999.0;
  }
  else {
    dVar12 = 99999999.0;
    dVar16 = -9999999.0;
    dVar14 = 9999999.0;
    lVar6 = 0;
    dVar18 = -9999999.0;
    do {
      dVar17 = *(double *)((long)&instance->positions->x + lVar6);
      dVar13 = dVar17;
      if (dVar14 <= dVar17) {
        dVar13 = dVar14;
      }
      dVar14 = dVar13;
      if (dVar18 <= dVar17) {
        dVar18 = dVar17;
      }
      if (dVar16 <= dVar17) {
        dVar16 = dVar17;
      }
      if (dVar12 <= dVar17) {
        dVar17 = dVar12;
      }
      dVar12 = dVar17;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar4 * 0x10 + 0x10 != lVar6);
  }
  if ((int)uVar4 < 0) {
    dVar17 = 9999999999.0;
  }
  else {
    uVar8 = (ulong)uVar4 + 1;
    dVar17 = 9999999999.0;
    lVar6 = 0;
    uVar7 = 0;
    do {
      lVar10 = 0;
      do {
        if (lVar6 != lVar10) {
          pVVar2 = instance->positions;
          dVar13 = *(double *)((long)&pVVar2->x + lVar10) - pVVar2[uVar7].x;
          dVar15 = *(double *)((long)&pVVar2->y + lVar10) - pVVar2[uVar7].y;
          dVar13 = dVar13 * dVar13 + dVar15 * dVar15;
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          if (dVar13 <= dVar17) {
            dVar17 = dVar13;
          }
        }
        lVar10 = lVar10 + 0x10;
      } while ((uVar8 & 0xffffffff) << 4 != lVar10);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 != uVar8);
  }
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  memset(local_2038,0,0x2000);
  snprintf(local_2038,0x2000,"neato \'-T%s\' -o \'%s\' 1> /dev/null 2>/dev/null",pcVar5,filepath);
  local_39 = 0;
  log_log(0x20,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
          ,0x6f,"%s :: Running popen(%s)\n","render_tour_image",local_2038);
  __s = popen(local_2038,"w");
  _Var11 = __s != (FILE *)0x0;
  if (_Var11) {
    fwrite("strict digraph {\n",0x11,1,__s);
    fwrite("    labelloc=\"t\"\n",0x11,1,__s);
    fwrite("    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = \"monospace\"]\n",0x46,1,__s)
    ;
    fwrite("    node [style=filled]\n",0x18,1,__s);
    if (-1 < (int)uVar4) {
      dVar18 = dVar18 - dVar14;
      dVar16 = dVar16 - dVar12;
      dVar13 = dVar18;
      if (dVar16 <= dVar18) {
        dVar13 = dVar16;
      }
      lVar6 = 8;
      uVar8 = 0;
      do {
        fprintf(__s,
                "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" shape=\"circle\" label=\"%d\"]\n"
                ,((*(double *)((long)instance->positions + lVar6 + -8) - dVar14) / dVar18) /
                 (dVar17 / dVar13),
                ((*(double *)((long)&instance->positions->x + lVar6) - dVar12) / dVar16) /
                (dVar17 / dVar13),uVar8 & 0xffffffff,uVar8 & 0xffffffff);
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar4 + 1 != uVar8);
    }
    if (tour->num_comps != 1) {
      __assert_fail("tour->num_comps == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                    ,0x8b,
                    "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)")
      ;
    }
    if (0 < tour->num_comps) {
      if ((int)uVar4 < 0) {
LAB_001062e8:
        __assert_fail("first_node_in_comp == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                      ,0x96,
                      "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)"
                     );
      }
      iVar9 = 0;
      do {
        iVar3 = tour->num_customers;
        if (iVar3 < 0) {
          iVar3 = -1;
        }
        uVar8 = 0;
        while( true ) {
          if (iVar3 + 1 == uVar8) goto LAB_001062c9;
          if (tour->comp[uVar8] == iVar9) break;
          uVar8 = uVar8 + 1;
          if (uVar4 + 1 == uVar8) goto LAB_001062e8;
        }
        if (uVar8 != 0) goto LAB_001062e8;
        if (tour->num_customers < 0) {
LAB_001062c9:
          __assert_fail("idx >= 0 && idx < len",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                        ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
        }
        uVar8 = 0;
        while (uVar1 = tour->succ[uVar8], uVar1 != 0) {
          fprintf(__s,"   %d -> %d [fontsize=\"8\"]\n",uVar8,(ulong)uVar1);
          if (((int)uVar1 < 0) || (uVar8 = (ulong)uVar1, tour->num_customers < (int)uVar1))
          goto LAB_001062c9;
        }
        fprintf(__s,"   %d -> %d [fontsize=\"8\"]\n",uVar8,0);
        iVar9 = iVar9 + 1;
      } while (iVar9 < tour->num_comps);
    }
    fwrite("}\n",2,1,__s);
    uVar4 = pclose(__s);
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
            ,0xb0,"%s :: graphviz dump creation process terminated with exit code %d",
            "render_tour_image",(ulong)uVar4);
    _Var11 = uVar4 == 0;
  }
  return _Var11;
}

Assistant:

bool render_tour_image(const char *filepath, const Instance *instance,
                       Tour *tour, const char *filext) {

    // Try to autodetect the filepath
    filext = guess_plot_filext(filepath, filext);

    int32_t n = instance->num_customers + 1;
    bool result = true;

    double min_dist = 9999999999;
    double smaller_coord = 9999999999;
    double llx, lly, w, h;

    compute_plotting_region(instance, &llx, &lly, &w, &h);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            if (i != j) {
                const Vec2d *ipos = &instance->positions[i];
                const Vec2d *jpos = &instance->positions[j];

                smaller_coord = MIN(smaller_coord, ipos->x);
                smaller_coord = MIN(smaller_coord, ipos->y);
                smaller_coord = MIN(smaller_coord, jpos->x);
                smaller_coord = MIN(smaller_coord, jpos->y);

                double d = vec2d_dist(ipos, jpos);
                min_dist = MIN(min_dist, d);
            }
        }
    }

    min_dist = sqrt(min_dist) / MIN(w, h);

    // min_dist = exp(min_dist);

    char command[8192] = "";

    snprintf(command, ARRAY_LEN(command),
             "neato '-T%s' -o '%s' 1> /dev/null 2>/dev/null", filext, filepath);
    command[ARRAY_LEN(command) - 1] = '\0';

    log_info("%s :: Running popen(%s)\n", __func__, command);

    FILE *gp = popen(command, "w");
    if (!gp) {
        result = false;
        goto terminate;
    }

    fprintf(gp, "strict digraph {\n");
    fprintf(gp, "    labelloc=\"t\"\n");
    fprintf(gp, "    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = "
                "\"monospace\"]\n");
    fprintf(gp, "    node [style=filled]\n");

    //
    // Declare the nodes and style them. Apply some size normalization for the
    // output render target.
    //
    for (int32_t i = 0; i < n; i++) {
        const Vec2d *pos = &instance->positions[i];

        fprintf(gp,
                "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" "
                "shape=\"circle\" label=\"%d\"]\n",
                i, ((pos->x - llx) / w / min_dist),
                ((pos->y - lly) / h / min_dist), i);
    }

    assert(tour->num_comps == 1);

    for (int32_t comp = 0; comp < tour->num_comps; comp++) {
        int32_t first_node_in_comp = -1;
        for (int32_t i = 0; i < n; i++) {
            if (*tcomp(tour, i) == comp) {
                first_node_in_comp = i;
                break;
            }
        }

        assert(first_node_in_comp == 0);

        if (first_node_in_comp != -1) {

            int32_t curr_vertex = first_node_in_comp;
            int32_t next_vertex = curr_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) !=
                   first_node_in_comp) {
                fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                        next_vertex);
                curr_vertex = next_vertex;
            }
            assert(next_vertex == first_node_in_comp);
            fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                    first_node_in_comp);
        }
    }

    fprintf(gp, "}\n");

terminate:
    if (gp) {
        int exit_code = pclose(gp);
        log_info("%s :: graphviz dump creation process terminated with "
                 "exit code %d",
                 __func__, exit_code);
        result = exit_code == 0;
    }

    return result;
}